

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O0

string * closeDirPath(string *__return_storage_ptr__,string *src,char delimiter)

{
  long lVar1;
  char *pcVar2;
  char local_19;
  char delimiter_local;
  string *src_local;
  
  local_19 = delimiter;
  if (delimiter == ' ') {
    local_19 = getDirSeparator();
  }
  lVar1 = std::__cxx11::string::length();
  if (lVar1 == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  }
  else {
    std::__cxx11::string::length();
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)src);
    if (*pcVar2 != '/') {
      std::__cxx11::string::length();
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)src);
      if (*pcVar2 != '\\') {
        std::operator+(__return_storage_ptr__,src,local_19);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)src);
  }
  return __return_storage_ptr__;
}

Assistant:

string closeDirPath(const string& src, char delimiter)
{
    if (delimiter == ' ')
        delimiter = getDirSeparator();
    if (src.length() == 0)
        return src;
    if (src[src.length() - 1] == '/' || src[src.length() - 1] == '\\')
        return src;
    return src + delimiter;
}